

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O3

char * GetModuleOutputPath(Allocator *allocator,InplaceStr moduleName)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  char *__s;
  
  uVar5 = (long)moduleName.end - (long)moduleName.begin;
  iVar1 = (*allocator->_vptr_Allocator[2])(allocator,(ulong)((int)uVar5 + 0xc));
  __s = (char *)CONCAT44(extraout_var,iVar1);
  builtin_strncpy(__s,"import_",8);
  sVar2 = strlen(__s);
  uVar5 = uVar5 & 0xffffffff;
  memcpy(__s + sVar2,moduleName.begin,uVar5);
  (__s + sVar2)[uVar5] = '\0';
  if (*__s != '\0') {
    uVar4 = 1;
    uVar6 = 0;
    do {
      if ((__s[uVar6] & 0xfeU) == 0x2e) {
        __s[uVar6] = '_';
      }
      uVar6 = (ulong)uVar4;
      sVar3 = strlen(__s);
      uVar4 = uVar4 + 1;
    } while (uVar6 < sVar3);
  }
  builtin_strncpy(__s + uVar5 + sVar2,".cpp",5);
  return __s;
}

Assistant:

const char* GetModuleOutputPath(Allocator *allocator, InplaceStr moduleName)
{
	unsigned length = unsigned(strlen("import_") + moduleName.length() + strlen(".cpp") + 1);
	char *targetName = (char*)allocator->alloc(length);

	char *pos = targetName;

	strcpy(pos, "import_");
	pos += strlen(pos);

	memcpy(pos, moduleName.begin, moduleName.length());
	pos += moduleName.length();

	*pos = 0;

	for(unsigned i = 0; i < strlen(targetName); i++)
	{
		if(targetName[i] == '/' || targetName[i] == '.')
			targetName[i] = '_';
	}

	strcpy(pos, ".cpp");

	return targetName;
}